

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_load_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  MemoryAccess access;
  Family family;
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined1 local_88 [16];
  _Manager_type local_78;
  _Elt_pointer pfStack_70;
  
  family = opcode.family;
  if (family == LAX) {
    puVar1 = &this->registers_->a;
    puVar2 = &this->registers_->x;
  }
  else {
    if (family == LDY) {
      puVar1 = &this->registers_->y;
    }
    else if (family == LDA) {
      puVar1 = &this->registers_->a;
    }
    else {
      if (family != LDX) {
        puVar2 = (uint8_t *)0x0;
        puVar1 = (uint8_t *)0x0;
        goto LAB_0010883b;
      }
      puVar1 = &this->registers_->x;
    }
    puVar2 = (uint8_t *)0x0;
  }
LAB_0010883b:
  access = get_memory_access(family);
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps((Pipeline *)local_88,this,opcode.address_mode,access);
  Pipeline::append(__return_storage_ptr__,(Pipeline *)local_88);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque((deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            *)(local_88 + 8));
  local_78 = (_Manager_type)0x0;
  pfStack_70 = (_Elt_pointer)0x0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = (_Map_pointer)0x0;
  local_88._0_8_ = operator_new(0x18);
  *(Mos6502 **)local_88._0_8_ = this;
  *(uint8_t **)(local_88._0_8_ + 8) = puVar1;
  *(uint8_t **)(local_88._0_8_ + 0x10) = puVar2;
  pfStack_70 = (_Elt_pointer)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:869:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:869:17)>
             ::_M_manager;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_load_instruction(Opcode opcode) {
    uint8_t *reg{};
    uint8_t *reg2{};
    if (opcode.family == Family::LDX) {
        reg = &registers_->x;
    } else if (opcode.family == Family::LDY) {
        reg = &registers_->y;
    } else if (opcode.family == Family::LDA) {
        reg = &registers_->a;
    } else if (opcode.family == Family::LAX) {
        reg = &registers_->a;
        reg2 = &registers_->x;
    }

    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    result.push([this, reg, reg2] {
        const uint8_t value = mmu_->read_byte(effective_address_);
        *reg = value;
        set_zero(value);
        set_negative(value);
        if (reg2) {
            *reg2 = value;
        }
    });

    return result;
}